

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsCreators.cpp
# Opt level: O3

void chrono::utils::AddCylinderGeometry
               (ChBody *body,shared_ptr<chrono::ChMaterialSurface> *material,double radius,
               double hlen,ChVector<double> *pos,ChQuaternion<double> *rot,bool visualization,
               shared_ptr<chrono::ChVisualMaterial> *vis_material)

{
  double dVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  undefined1 auVar4 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  ChCylinderShape *this;
  ChBody *model;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined8 in_XMM1_Qb;
  undefined1 auVar8 [32];
  shared_ptr<chrono::ChCylinderShape> cylinder;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_130;
  undefined1 local_128 [24];
  undefined1 auStack_110 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_100;
  element_type *local_f8;
  ChSystem *pCStack_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0;
  ChVisualModel *local_d8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_d0;
  pointer local_c8;
  uint uStack_c0;
  uint uStack_bc;
  undefined1 local_b8 [40];
  double local_90;
  double dStack_88;
  double local_80;
  ChMatrix33<double> local_78;
  
  peVar2 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  p_Var5 = (body->collision_model).
           super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
    }
  }
  local_f8 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  pCStack_f0 = (ChSystem *)
               (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)
               ._M_refcount._M_pi;
  p_Var3 = (material->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
    }
  }
  local_e0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)vis_material;
  local_c8 = (pointer)hlen;
  _uStack_c0 = in_XMM1_Qb;
  ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)local_b8,rot);
  (*peVar2->_vptr_ChCollisionModel[8])(radius,radius,local_c8,peVar2,&local_f8,pos,local_b8);
  if (pCStack_f0 != (ChSystem *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pCStack_f0);
  }
  if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
  }
  if (visualization) {
    model = body;
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b8._8_8_);
    }
    if ((_func_int **)local_b8._0_8_ == (_func_int **)0x0) {
      p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)::operator_new(0x40);
      p_Var5->_M_use_count = 1;
      p_Var5->_M_weak_count = 1;
      local_128._0_8_ = p_Var5 + 1;
      p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00b0bf68;
      p_Var5[1]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[1]._M_use_count = 0;
      p_Var5[1]._M_weak_count = 0;
      p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[2]._M_weak_count = 0;
      p_Var5[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[2]._M_use_count = 0;
      p_Var5[2]._M_weak_count = 0;
      p_Var5[3]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var5[3]._M_use_count = 0;
      p_Var5[3]._M_weak_count = 0;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = 2;
      }
      model = (ChBody *)local_128;
      local_128._8_8_ = p_Var5;
      ChPhysicsItem::AddVisualModel
                (&body->super_ChPhysicsItem,(shared_ptr<chrono::ChVisualModel> *)model);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var5);
    }
    this = (ChCylinderShape *)ChVisualShape::operator_new((ChVisualShape *)0x68,(size_t)model);
    ChCylinderShape::ChCylinderShape(this);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChCylinderShape*>
              (&_Stack_130,this);
    (this->gcylinder).rad = radius;
    auVar4._8_4_ = uStack_c0;
    auVar4._12_4_ = uStack_bc;
    auVar4._0_8_ = local_c8;
    (this->gcylinder).p1.m_data[0] = 0.0;
    (this->gcylinder).p1.m_data[1] = (double)local_c8;
    auVar6._8_8_ = 0x8000000000000000;
    auVar6._0_8_ = 0x8000000000000000;
    auVar6 = vxorpd_avx512vl(auVar4,auVar6);
    (this->gcylinder).p1.m_data[2] = 0.0;
    (this->gcylinder).p2.m_data[0] = 0.0;
    dVar1 = (double)vmovlpd_avx(auVar6);
    (this->gcylinder).p2.m_data[1] = dVar1;
    (this->gcylinder).p2.m_data[2] = 0.0;
    auStack_110._8_8_ =
         ((__shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2> *)
         &(local_e0._M_pi)->_vptr__Sp_counted_base)->_M_ptr;
    p_Stack_100 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_e0._M_pi)->_M_use_count)->
                  _M_pi;
    p_Var5 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(local_e0._M_pi)->_M_use_count)->_M_pi;
    if (p_Var5 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var5->_M_use_count = p_Var5->_M_use_count + 1;
      }
    }
    ChVisualShape::AddMaterial
              ((ChVisualShape *)this,(shared_ptr<chrono::ChVisualMaterial> *)(auStack_110 + 8));
    if (p_Stack_100 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_100);
    }
    ChPhysicsItem::GetVisualModel(&body->super_ChPhysicsItem);
    auStack_110._0_8_ = _Stack_130._M_pi;
    if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_130._M_pi)->_M_use_count = (_Stack_130._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_130._M_pi)->_M_use_count = (_Stack_130._M_pi)->_M_use_count + 1;
      }
    }
    local_b8._0_8_ = &PTR__ChFrame_00b03780;
    dVar1 = pos->m_data[2];
    auVar7._8_8_ = dVar1;
    auVar7._0_8_ = dVar1;
    auVar7._16_8_ = dVar1;
    auVar7._24_8_ = dVar1;
    auVar7 = vblendps_avx(ZEXT1632(*(undefined1 (*) [16])pos->m_data),auVar7,0x30);
    dVar1 = rot->m_data[0];
    auVar8._8_8_ = dVar1;
    auVar8._0_8_ = dVar1;
    auVar8._16_8_ = dVar1;
    auVar8._24_8_ = dVar1;
    local_b8._8_32_ = vblendps_avx(auVar7,auVar8,0xc0);
    local_90 = rot->m_data[1];
    dStack_88 = rot->m_data[2];
    local_80 = rot->m_data[3];
    local_128._16_8_ = this;
    ChMatrix33<double>::ChMatrix33(&local_78,rot);
    ChVisualModel::AddShape
              (local_d8,(shared_ptr<chrono::ChVisualShape> *)(local_128 + 0x10),
               (ChFrame<double> *)local_b8);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_110._0_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auStack_110._0_8_);
    }
    if (local_d0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d0);
    }
    if (_Stack_130._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_130._M_pi);
    }
  }
  return;
}

Assistant:

void AddCylinderGeometry(ChBody* body,
                         std::shared_ptr<ChMaterialSurface> material,
                         double radius,
                         double hlen,
                         const ChVector<>& pos,
                         const ChQuaternion<>& rot,
                         bool visualization,
                         std::shared_ptr<ChVisualMaterial> vis_material) {
    body->GetCollisionModel()->AddCylinder(material, radius, radius, hlen, pos, rot);

    if (visualization) {
        if (!body->GetVisualModel()) {
            auto model = chrono_types::make_shared<ChVisualModel>();
            body->AddVisualModel(model);
        }
        auto cylinder = chrono_types::make_shared<ChCylinderShape>();
        cylinder->GetCylinderGeometry().rad = radius;
        cylinder->GetCylinderGeometry().p1 = ChVector<>(0, hlen, 0);
        cylinder->GetCylinderGeometry().p2 = ChVector<>(0, -hlen, 0);
        cylinder->AddMaterial(vis_material);
        body->GetVisualModel()->AddShape(cylinder, ChFrame<>(pos, rot));
    }
}